

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall
wasm::WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
      *this,Module *module)

{
  PassRunner *pPVar1;
  int iVar2;
  undefined1 local_2c0 [8];
  PassRunner runner;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_180;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_148;
  element_type *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_98;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_48;
  __alloc_node_gen_t __alloc_node_gen_2;
  _Head_base<0UL,_wasm::Pass_*,_false> local_38;
  
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    iVar2 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((char)iVar2 == '\0') {
      (this->super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>).
      super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.currModule =
           module;
      Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::doWalkModule
                (&(this->
                  super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>).
                  super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>,
                 module);
      (this->super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>).
      super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.currModule =
           (Module *)0x0;
    }
    else {
      pPVar1 = (this->super_Pass).runner;
      local_d8._0_1_ = (pPVar1->options).ignoreImplicitTraps;
      local_d8._1_1_ = (pPVar1->options).trapsNeverHappen;
      local_d8._2_1_ = (pPVar1->options).lowMemoryUnused;
      local_d8._3_1_ = (pPVar1->options).fastMath;
      local_d8._4_1_ = (pPVar1->options).zeroFilledMemory;
      local_d8._5_1_ = (pPVar1->options).closedWorld;
      local_d8._6_1_ = (pPVar1->options).debugInfo;
      local_d8._7_1_ = (pPVar1->options).targetJS;
      local_f8._0_1_ = (pPVar1->options).debug;
      local_f8._1_1_ = (pPVar1->options).validate;
      local_f8._2_1_ = (pPVar1->options).validateGlobally;
      local_f8._3_1_ = (pPVar1->options).field_0x3;
      local_f8._4_4_ = (pPVar1->options).optimizeLevel;
      uStack_f0._0_4_ = (pPVar1->options).shrinkLevel;
      uStack_f0._4_4_ = (pPVar1->options).inlining.alwaysInlineMaxSize;
      local_e8._0_4_ = (pPVar1->options).inlining.oneCallerInlineMaxSize;
      local_e8._4_4_ = (pPVar1->options).inlining.flexibleInlineMaxSize;
      uStack_e0._0_1_ = (pPVar1->options).inlining.allowFunctionsWithLoops;
      uStack_e0._1_3_ = *(undefined3 *)&(pPVar1->options).inlining.field_0xd;
      uStack_e0._4_4_ = (pPVar1->options).inlining.partialInliningIfs;
      local_d0._M_buckets = (__buckets_ptr)0x0;
      local_d0._M_bucket_count = (pPVar1->options).arguments._M_h._M_bucket_count;
      local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d0._M_element_count = (pPVar1->options).arguments._M_h._M_element_count;
      local_d0._M_rehash_policy._M_max_load_factor =
           (pPVar1->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
      local_d0._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar1->options).arguments._M_h._M_rehash_policy.field_0x4;
      local_d0._M_rehash_policy._M_next_resize =
           (pPVar1->options).arguments._M_h._M_rehash_policy._M_next_resize;
      local_d0._M_single_bucket = (__node_base_ptr)0x0;
      local_2c0 = (undefined1  [8])&local_d0;
      __alloc_node_gen_2._M_h = (__hashtable_alloc *)module;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_d0,&(pPVar1->options).arguments._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)local_2c0);
      local_98._M_buckets = (__buckets_ptr)0x0;
      local_98._M_bucket_count = (pPVar1->options).passesToSkip._M_h._M_bucket_count;
      local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_98._M_element_count = (pPVar1->options).passesToSkip._M_h._M_element_count;
      local_98._M_rehash_policy._M_max_load_factor =
           (pPVar1->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
      local_98._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar1->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
      local_98._M_rehash_policy._M_next_resize =
           (pPVar1->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
      local_98._M_single_bucket = (__node_base_ptr)0x0;
      local_2c0 = (undefined1  [8])&local_98;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_98,&(pPVar1->options).passesToSkip._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)local_2c0);
      local_60 = (pPVar1->options).funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      local_58 = (pPVar1->options).funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_58->_M_use_count = local_58->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_58->_M_use_count = local_58->_M_use_count + 1;
        }
      }
      local_f8 = (__node_base_ptr)
                 CONCAT44(~-(uint)((int)local_f8._4_4_ < 1) & 1 |
                          local_f8._4_4_ & -(uint)((int)local_f8._4_4_ < 1),(undefined4)local_f8);
      uStack_f0 = CONCAT44(uStack_f0._4_4_,
                           ~-(uint)((int)(uint)uStack_f0 < 1) & 1 |
                           (uint)uStack_f0 & -(uint)((int)(uint)uStack_f0 < 1));
      runner.skippedPasses._M_h._M_single_bucket = local_f8;
      local_180._M_buckets = (__buckets_ptr)0x0;
      local_180._M_bucket_count = local_d0._M_bucket_count;
      local_180._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_180._M_element_count = local_d0._M_element_count;
      local_180._M_rehash_policy._M_max_load_factor = local_d0._M_rehash_policy._M_max_load_factor;
      local_180._M_rehash_policy._4_4_ = local_d0._M_rehash_policy._4_4_;
      local_180._M_rehash_policy._M_next_resize = local_d0._M_rehash_policy._M_next_resize;
      local_180._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)&local_180;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_180,&local_d0,&local_48);
      local_148._M_buckets = (__buckets_ptr)0x0;
      local_148._M_bucket_count = local_98._M_bucket_count;
      local_148._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_148._M_element_count = local_98._M_element_count;
      local_148._M_rehash_policy._M_max_load_factor = local_98._M_rehash_policy._M_max_load_factor;
      local_148._M_rehash_policy._4_4_ = local_98._M_rehash_policy._4_4_;
      local_148._M_rehash_policy._M_next_resize = local_98._M_rehash_policy._M_next_resize;
      local_148._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)&local_148;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_148,&local_98,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)&local_48);
      local_110 = local_60;
      local_108 = local_58;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_58->_M_use_count = local_58->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_58->_M_use_count = local_58->_M_use_count + 1;
        }
      }
      PassRunner::PassRunner
                ((PassRunner *)local_2c0,(Module *)__alloc_node_gen_2._M_h,
                 (PassOptions *)&runner.skippedPasses._M_h._M_single_bucket);
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_148);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_180);
      runner.options.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_1_ = 1;
      (*(this->super_Pass)._vptr_Pass[5])(&local_38,this);
      PassRunner::add((PassRunner *)local_2c0,
                      (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_38);
      if (local_38._M_head_impl != (Pass *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Pass[1])();
      }
      local_38._M_head_impl = (Pass *)0x0;
      PassRunner::run((PassRunner *)local_2c0);
      PassRunner::~PassRunner((PassRunner *)local_2c0);
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_98);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_d0);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,500,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::ReorderLocals>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::ReorderLocals>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }